

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CoverageBinSymbol::TransRangeList::TransRangeList
          (TransRangeList *this,TransRangeSyntax *syntax,Type *type,ASTContext *context)

{
  short sVar1;
  SyntaxNode *this_00;
  bool bVar2;
  bitmask<slang::ast::ASTFlags> extraFlags;
  Compilation *dst;
  Expression *pEVar3;
  RangeSelectSyntax *this_01;
  ExpressionSyntax *exprSyntax;
  Type *in_RCX;
  ASTContext *in_RDX;
  EVP_PKEY_CTX *src;
  long in_RSI;
  undefined8 *in_RDI;
  RangeSelectSyntax *rss;
  SelectorSyntax *sel;
  anon_class_8_1_bc11688f bindCount;
  Compilation *comp;
  Expression *expr;
  ExpressionSyntax *elem;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  iterator_base<const_slang::syntax::ExpressionSyntax_*> *in_stack_fffffffffffffe48;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffe50;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_stack_fffffffffffffe58;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_fffffffffffffe60;
  ExpressionSyntax *in_stack_fffffffffffffe68;
  anon_class_8_1_bc11688f *in_stack_fffffffffffffe70;
  Type *lvalueType;
  ASTContext *context_00;
  Expression *in_stack_fffffffffffffec8;
  undefined8 local_d0;
  undefined8 local_c8;
  bitmask<slang::ast::ASTFlags> local_b0;
  Expression *local_a8;
  ExpressionSyntax *local_a0;
  const_iterator local_98;
  const_iterator local_78;
  long local_68;
  SmallVectorBase<const_slang::ast::Expression_*> local_60 [2];
  Type *local_20;
  ASTContext *local_18;
  long local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x5e8cfc);
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x5e8d28);
  local_68 = local_10 + 0x18;
  local_78 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x5e8d49);
  local_98 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                       ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x5e8d88);
  while( true ) {
    bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    extraFlags.m_bits =
         (underlying_type)
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                      *)0x5e8df7);
    local_b0.m_bits = 0;
    lvalueType = local_20;
    context_00 = local_18;
    local_a0 = (ExpressionSyntax *)extraFlags.m_bits;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_b0);
    in_stack_fffffffffffffec8 =
         bindCovergroupExpr((ExpressionSyntax *)in_stack_fffffffffffffec8,context_00,lvalueType,
                            extraFlags);
    local_a8 = in_stack_fffffffffffffec8;
    SmallVectorBase<const_slang::ast::Expression_*>::push_back
              (in_stack_fffffffffffffe50,(Expression **)in_stack_fffffffffffffe48);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                *)in_stack_fffffffffffffe50);
  }
  dst = ASTContext::getCompilation((ASTContext *)0x5e8ef7);
  SmallVectorBase<const_slang::ast::Expression_*>::copy(local_60,(EVP_PKEY_CTX *)dst,src);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *in_RDI = local_d0;
  in_RDI[1] = local_c8;
  if (*(long *)(local_10 + 0x50) != 0) {
    sVar1 = *(short *)(*(long *)(local_10 + 0x50) + 0x28);
    if (sVar1 == 0x1b) {
      *(undefined4 *)(in_RDI + 4) = 1;
    }
    else if (sVar1 == 0x26) {
      *(undefined4 *)(in_RDI + 4) = 3;
    }
    else {
      *(undefined4 *)(in_RDI + 4) = 2;
    }
    this_00 = *(SyntaxNode **)(*(long *)(local_10 + 0x50) + 0x38);
    if (this_00 != (SyntaxNode *)0x0) {
      if (this_00->kind == BitSelect) {
        slang::syntax::SyntaxNode::as<slang::syntax::BitSelectSyntax>(this_00);
        not_null<slang::syntax::ExpressionSyntax_*>::operator*
                  ((not_null<slang::syntax::ExpressionSyntax_*> *)0x5e9052);
        pEVar3 = TransRangeList::anon_class_8_1_bc11688f::operator()
                           (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        in_RDI[2] = pEVar3;
      }
      else {
        this_01 = slang::syntax::SyntaxNode::as<slang::syntax::RangeSelectSyntax>(this_00);
        exprSyntax = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                               ((not_null<slang::syntax::ExpressionSyntax_*> *)0x5e90ba);
        pEVar3 = TransRangeList::anon_class_8_1_bc11688f::operator()
                           ((anon_class_8_1_bc11688f *)this_01,exprSyntax);
        in_RDI[2] = pEVar3;
        not_null<slang::syntax::ExpressionSyntax_*>::operator*
                  ((not_null<slang::syntax::ExpressionSyntax_*> *)0x5e90fc);
        pEVar3 = TransRangeList::anon_class_8_1_bc11688f::operator()
                           ((anon_class_8_1_bc11688f *)this_01,exprSyntax);
        in_RDI[3] = pEVar3;
      }
    }
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x5e913e);
  return;
}

Assistant:

CoverageBinSymbol::TransRangeList::TransRangeList(const TransRangeSyntax& syntax, const Type& type,
                                                  const ASTContext& context) {
    SmallVector<const Expression*> buffer;
    for (auto elem : syntax.items) {
        auto& expr = bindCovergroupExpr(*elem, context, &type);
        buffer.push_back(&expr);
    }

    auto& comp = context.getCompilation();
    items = buffer.copy(comp);

    if (syntax.repeat) {
        switch (syntax.repeat->specifier.kind) {
            case TokenKind::Star:
                repeatKind = Consecutive;
                break;
            case TokenKind::Equals:
                repeatKind = Nonconsecutive;
                break;
            case TokenKind::MinusArrow:
                repeatKind = GoTo;
                break;
            default:
                SLANG_UNREACHABLE;
        }

        auto bindCount = [&](const ExpressionSyntax& exprSyntax) {
            auto& expr = bindCovergroupExpr(exprSyntax, context);
            context.requireIntegral(expr);
            return &expr;
        };

        if (auto sel = syntax.repeat->selector) {
            if (sel->kind == SyntaxKind::BitSelect) {
                repeatFrom = bindCount(*sel->as<BitSelectSyntax>().expr);
            }
            else {
                auto& rss = sel->as<RangeSelectSyntax>();
                repeatFrom = bindCount(*rss.left);
                repeatTo = bindCount(*rss.right);
            }
        }
    }
}